

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O1

void __thiscall LinearNE<0,_1,_1>::wakeup(LinearNE<0,_1,_1> *this,int i,int param_2)

{
  long lVar1;
  int iVar2;
  TrailElem local_40;
  
  if (i < this->sz) {
    local_40.pt = &(this->num_unfixed).v;
    local_40.x = (this->num_unfixed).v;
    iVar2 = local_40.x + -1;
    local_40.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_40);
    (this->num_unfixed).v = iVar2;
    lVar1 = (this->sum_fixed).v;
    if (i < *(int *)&(this->super_Propagator).field_0x14) {
      iVar2 = ((this->x[i].var)->min).v;
    }
    else {
      iVar2 = -((this->y[i].var)->min).v;
    }
    local_40.x = (int)(this->sum_fixed).v;
    local_40.sz = 4;
    local_40.pt = (int *)&this->sum_fixed;
    vec<TrailElem>::push(&engine.trail,&local_40);
    local_40.pt = (int *)((long)&(this->sum_fixed).v + 4);
    local_40.x = *(int *)((long)&(this->sum_fixed).v + 4);
    local_40.sz = 4;
    vec<TrailElem>::push(&engine.trail,&local_40);
    (this->sum_fixed).v = lVar1 + iVar2;
  }
  iVar2 = (this->num_unfixed).v;
  if ((iVar2 < 2) &&
     ((((uint)(this->r).s * -2 + 1 == (int)sat.assigns.data[(uint)(this->r).v] ||
       ((iVar2 == 0 && (sat.assigns.data[(uint)(this->r).v] == '\0')))) &&
      ((this->super_Propagator).in_queue == false)))) {
    (this->super_Propagator).in_queue = true;
    local_40.pt = (int *)this;
    vec<Propagator_*>::push
              (engine.p_queue.data + (uint)(this->super_Propagator).priority,
               (Propagator **)&local_40);
  }
  return;
}

Assistant:

void wakeup(int i, int /*c*/) override {
		if (i < sz) {
			num_unfixed = num_unfixed - 1;
			if (i < sp) {
				sum_fixed = sum_fixed + x[i].getVal();
			} else {
				sum_fixed = sum_fixed + y[i].getVal();
			}
		}
		if (num_unfixed > 1) {
			return;
		}
		if ((R == 0) || r.isTrue() || (!r.isFixed() && num_unfixed == 0)) {
			pushInQueue();
		}
	}